

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mplayer.cpp
# Opt level: O2

void __thiscall V2MPlayer::Reset(V2MPlayer *this)

{
  uint32_t samplerate;
  uint8_t *puVar1;
  uint uVar2;
  uint uVar3;
  uint8_t *puVar4;
  uint8_t **ppuVar5;
  long lVar6;
  Channel *pCVar7;
  uint8_t *puVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  
  (this->m_state).time = 0;
  (this->m_state).nexttime = 0xffffffff;
  puVar4 = (this->m_base).gptr;
  (this->m_state).gptr = puVar4;
  (this->m_state).gnr = 0;
  uVar2 = (this->m_base).gdnum;
  if ((ulong)uVar2 == 0) {
    uVar2 = 0xffffffff;
  }
  else {
    uVar2 = (uint)CONCAT12(puVar4[uVar2 * 2],CONCAT11(puVar4[uVar2],*puVar4));
    (this->m_state).gnt = uVar2;
    (this->m_state).nexttime = uVar2;
  }
  puVar4 = &(this->m_state).chan[0].ctl[0].lastcc;
  ppuVar5 = &(this->m_base).chan[0].ctl[0].ccptr;
  for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
    uVar10 = (this->m_base).chan[lVar6].notenum;
    if ((ulong)uVar10 != 0) {
      pCVar7 = (this->m_state).chan + lVar6;
      puVar8 = (this->m_base).chan[lVar6].noteptr;
      pCVar7->noteptr = puVar8;
      pCVar7->lastnte = '\0';
      pCVar7->lastvel = '\0';
      pCVar7->notenr = 0;
      uVar10 = (uint)CONCAT12(puVar8[uVar10 * 2],CONCAT11(puVar8[uVar10],*puVar8));
      pCVar7->notent = uVar10;
      if (uVar10 < uVar2) {
        (this->m_state).nexttime = uVar10;
        uVar2 = uVar10;
      }
      puVar8 = (this->m_base).chan[lVar6].pcptr;
      pCVar7->pcptr = puVar8;
      pCVar7->lastpc = '\0';
      pCVar7->pcnr = 0;
      uVar10 = (this->m_base).chan[lVar6].pcnum;
      uVar11 = (ulong)uVar10;
      if (uVar11 != 0) {
        uVar3 = (uint)CONCAT12(puVar8[uVar10 * 2],CONCAT11(puVar8[uVar11],*puVar8));
        pCVar7->pcnt = uVar3;
        if (uVar3 < uVar2) {
          (this->m_state).nexttime = uVar3;
          uVar2 = uVar3;
        }
      }
      puVar8 = (this->m_base).chan[lVar6].pbptr;
      pCVar7->lastpb0 = '\0';
      pCVar7->lastpb1 = '\0';
      pCVar7->pbnr = 0;
      pCVar7->pbptr = puVar8;
      if (uVar11 != 0) {
        uVar10 = (uint)CONCAT12(puVar8[uVar10 * 2],CONCAT11(puVar8[uVar11],*puVar8));
        pCVar7->pbnt = uVar10;
        if (uVar10 < uVar2) {
          (this->m_state).nexttime = uVar10;
          uVar2 = uVar10;
        }
      }
      puVar8 = puVar4;
      for (lVar9 = 0; lVar9 != 0x70; lVar9 = lVar9 + 0x10) {
        puVar1 = *(uint8_t **)((long)ppuVar5 + lVar9);
        ((CC *)(puVar8 + -0x10))->ccptr = puVar1;
        *puVar8 = '\0';
        *(uint32_t *)(puVar8 + -4) = 0;
        uVar10 = *(uint *)((long)ppuVar5 + lVar9 + -8);
        if ((ulong)uVar10 != 0) {
          uVar10 = (uint)CONCAT12(puVar1[uVar10 * 2],CONCAT11(puVar1[uVar10],*puVar1));
          *(uint *)(puVar8 + -8) = uVar10;
          if (uVar10 < uVar2) {
            (this->m_state).nexttime = uVar10;
            uVar2 = uVar10;
          }
        }
        puVar8 = puVar8 + 0x18;
      }
    }
    puVar4 = puVar4 + 0xf0;
    ppuVar5 = ppuVar5 + 0x14;
  }
  samplerate = this->m_samplerate;
  (this->m_state).usecs = samplerate * 5000;
  (this->m_state).num = 4;
  (this->m_state).den = 4;
  (this->m_state).tpq = 8;
  (this->m_state).bar = 0;
  (this->m_state).beat = 0;
  (this->m_state).tick = 0;
  (this->m_state).smplrem = 0;
  (this->m_state).cursmpl = 0;
  if (samplerate != 0) {
    synthInit(this,(this->m_base).patchmap,samplerate);
    synthSetGlobals(this,(this->m_base).globals);
    synthSetLyrics(this,(this->m_base).speechptrs);
    return;
  }
  return;
}

Assistant:

void V2MPlayer::Reset()
{
    m_state.time = 0;
    m_state.nexttime = (uint32_t)-1;

    m_state.gptr = m_base.gptr;
    m_state.gnr  = 0;
    UPDATENT(m_state.gnr, m_state.gnt, m_state.gptr, m_base.gdnum);
    for (int ch = 0; ch < 16; ch++)
    {
        V2MBase::Channel &bc = m_base.chan[ch];
        PlayerState::Channel &sc = m_state.chan[ch];

        if (!bc.notenum)
            continue;
        sc.noteptr = bc.noteptr;
        sc.notenr  = sc.lastnte = sc.lastvel = 0;
        UPDATENT(sc.notenr,sc.notent, sc.noteptr, bc.notenum);
        sc.pcptr = bc.pcptr;
        sc.pcnr  = sc.lastpc=0;
        UPDATENT(sc.pcnr,sc.pcnt, sc.pcptr, bc.pcnum);
        sc.pbptr = bc.pbptr;
        sc.pbnr  = sc.lastpb0 = sc.lastpb1 = 0;
        UPDATENT(sc.pbnr,sc.pbnt, sc.pbptr, bc.pcnum);
        for (int cn = 0; cn < 7; cn++)
        {
            V2MBase::Channel::CC &bcc = bc.ctl[cn];
            PlayerState::Channel::CC &scc = sc.ctl[cn];
            scc.ccptr = bcc.ccptr;
            scc.ccnr  = scc.lastcc=0;
            UPDATENT(scc.ccnr, scc.ccnt, scc.ccptr, bcc.ccnum);
        }
    }
    m_state.usecs = 5000*m_samplerate;
    m_state.num   = 4;
    m_state.den   = 4;
    m_state.tpq   = 8;
    m_state.bar   = 0;
    m_state.beat  = 0;
    m_state.tick  = 0;
    m_state.smplrem = 0;
    m_state.cursmpl = 0;

    if (m_samplerate)
    {
        synthInit(m_synth, (void*)m_base.patchmap, m_samplerate);
        synthSetGlobals(m_synth, (void*)m_base.globals);
        synthSetLyrics(m_synth, m_base.speechptrs);
    }
}